

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O2

ITexture * __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::getTexture(COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
             *this)

{
  pointer ppIVar1;
  ITexture *pIVar2;
  ulong uVar3;
  
  ppIVar1 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if (((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3 & 0xffffffff
        ) <= uVar3) {
      return (ITexture *)0x0;
    }
    pIVar2 = ppIVar1[uVar3];
    uVar3 = uVar3 + 1;
  } while (pIVar2 == (ITexture *)0x0);
  return pIVar2;
}

Assistant:

ITexture *getTexture() const
	{
		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				return Textures[i];
		}

		return 0;
	}